

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_append_text_utf8(nk_str *str,char *text,int len)

{
  int iVar1;
  int len_00;
  int iVar2;
  bool bVar3;
  nk_rune unicode;
  
  iVar2 = 0;
  if (len != 0 && (text != (char *)0x0 && str != (nk_str *)0x0)) {
    len_00 = 0;
    iVar2 = 0;
    if (0 < len) {
      iVar2 = len;
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      iVar1 = nk_utf_decode(text + len_00,&unicode,4);
      len_00 = len_00 + iVar1;
    }
    nk_str_append_text_char(str,text,len_00);
    iVar2 = len;
  }
  return iVar2;
}

Assistant:

NK_API int
nk_str_append_text_utf8(struct nk_str *str, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_append_text_char(str, text, byte_len);
    return len;
}